

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool realloc_array(roaring_array_t *ra,int32_t new_capacity)

{
  void **__dest;
  uint8_t *__dest_00;
  void **__src;
  void **__dest_01;
  size_t __n;
  long lVar1;
  
  if (new_capacity == 0) {
    free(ra->containers);
    ra->keys = (uint16_t *)0x0;
    ra->typecodes = (uint8_t *)0x0;
    *(undefined8 *)&ra->allocation_size = 0;
    *(undefined8 *)((long)&ra->containers + 4) = 0;
  }
  else {
    lVar1 = (long)new_capacity;
    __dest_01 = (void **)malloc(lVar1 * 0xb);
    if (__dest_01 == (void **)0x0) {
      return false;
    }
    __dest = __dest_01 + lVar1;
    __dest_00 = (uint8_t *)((long)__dest + lVar1 * 2);
    if (__dest_00 + lVar1 != (uint8_t *)(lVar1 * 0xb + (long)__dest_01)) {
      __assert_fail("(char *)(newtypecodes + new_capacity) == (char *)bigalloc + memoryneeded",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x466c,"_Bool realloc_array(roaring_array_t *, int32_t)");
    }
    __src = ra->containers;
    __n = (size_t)ra->size;
    if (0 < (long)__n) {
      memcpy(__dest_01,__src,__n * 8);
      memcpy(__dest,ra->keys,__n * 2);
      memcpy(__dest_00,ra->typecodes,__n);
    }
    ra->containers = __dest_01;
    ra->keys = (uint16_t *)__dest;
    ra->typecodes = __dest_00;
    ra->allocation_size = new_capacity;
    free(__src);
  }
  return true;
}

Assistant:

static bool realloc_array(roaring_array_t *ra, int32_t new_capacity) {
    //
    // Note: not implemented using C's realloc(), because the memory layout is
    // Struct-of-Arrays vs. Array-of-Structs:
    // https://github.com/RoaringBitmap/CRoaring/issues/256

    if ( new_capacity == 0 ) {
      free(ra->containers);
      ra->containers = NULL;
      ra->keys = NULL;
      ra->typecodes = NULL;
      ra->allocation_size = 0;
      return true;
    }
    const size_t memoryneeded = new_capacity * (
                sizeof(uint16_t) + sizeof(container_t *) + sizeof(uint8_t));
    void *bigalloc = malloc(memoryneeded);
    if (!bigalloc) return false;
    void *oldbigalloc = ra->containers;
    container_t **newcontainers = (container_t **)bigalloc;
    uint16_t *newkeys = (uint16_t *)(newcontainers + new_capacity);
    uint8_t *newtypecodes = (uint8_t *)(newkeys + new_capacity);
    assert((char *)(newtypecodes + new_capacity) ==
           (char *)bigalloc + memoryneeded);
    if(ra->size > 0) {
      memcpy(newcontainers, ra->containers, sizeof(container_t *) * ra->size);
      memcpy(newkeys, ra->keys, sizeof(uint16_t) * ra->size);
      memcpy(newtypecodes, ra->typecodes, sizeof(uint8_t) * ra->size);
    }
    ra->containers = newcontainers;
    ra->keys = newkeys;
    ra->typecodes = newtypecodes;
    ra->allocation_size = new_capacity;
    free(oldbigalloc);
    return true;
}